

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O0

void ga_acc_(Integer *g_a,Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi,void *buf,Integer *ld,
            void *alpha)

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_R8;
  Integer in_R9;
  Integer hi [2];
  Integer lo [2];
  Integer *in_stack_ffffffffffffffc8;
  
  pnga_acc(in_R9,in_stack_ffffffffffffffc8,(Integer *)*in_RCX,(void *)*in_RSI,(Integer *)*in_R8,
           (void *)*in_RDX);
  return;
}

Assistant:

void FATR ga_acc_(Integer *g_a, Integer *ilo, Integer *ihi,
                  Integer *jlo, Integer *jhi, void *buf, Integer *ld,
                  void *alpha)
{
    Integer lo[2], hi[2];
    lo[0]=*ilo;
    lo[1]=*jlo;
    hi[0]=*ihi;
    hi[1]=*jhi;
    wnga_acc(*g_a, lo, hi, buf, ld, alpha);
}